

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::quatf> *value)

{
  bool bVar1;
  quatf v;
  quatf qStack_28;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    bVar1 = ReadBasicType(this,&qStack_28);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::quatf>::operator=(value,&qStack_28);
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::quatf> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::quatf v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}